

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inverters.cpp
# Opt level: O2

bool Kernel::Rebalancing::Inverters::nonZero<Kernel::NumTraits<Kernel::RealConstantType>>
               (TermList *t)

{
  bool bVar1;
  Option<const_Kernel::RealConstantType_&> n2;
  Option<const_Kernel::RealConstantType_&> n1;
  RationalConstantType *local_70;
  int local_68 [2];
  RationalConstantType local_60;
  RationalConstantType *local_40;
  RationalConstantType local_38;
  
  NumTraits<Kernel::RealConstantType>::tryNumeral
            ((NumTraits<Kernel::RealConstantType> *)&local_40,(TermList)t->_content);
  NumTraits<Kernel::RealConstantType>::tryNumeral
            ((NumTraits<Kernel::RealConstantType> *)&local_70,(TermList)t->_content);
  if (local_40 == (RationalConstantType *)0x0) {
    if (local_70 == (RationalConstantType *)0x0) {
      return false;
    }
  }
  else {
    RationalConstantType::RationalConstantType(&local_38,local_40);
    local_68[1] = 0;
    bVar1 = Kernel::operator!=((RealConstantType *)&local_38,local_68 + 1);
    if (bVar1) {
      bVar1 = true;
      goto LAB_0047f48e;
    }
    if (local_70 == (RationalConstantType *)0x0) {
      bVar1 = false;
      goto LAB_0047f48e;
    }
  }
  RationalConstantType::RationalConstantType(&local_60,local_70);
  local_68[0] = 0;
  bVar1 = Kernel::operator!=((RealConstantType *)&local_60,local_68);
  RationalConstantType::~RationalConstantType(&local_60);
  if (local_40 == (RationalConstantType *)0x0) {
    return bVar1;
  }
LAB_0047f48e:
  RationalConstantType::~RationalConstantType(&local_38);
  return bVar1;
}

Assistant:

bool nonZero(const TermList &t) {
  NumTraits n{};
  auto n1 = n.tryNumeral(t);
  auto n2 = asig(n).tryNumeral(t);
  return ( n1.isSome() && *n1 != 0 ) 
      || ( n2.isSome() && *n2 != 0 );
}